

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::singletonRow(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row)

{
  Result RVar1;
  uint *puVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  int in_EDX;
  HPresolve *in_RDI;
  double dVar8;
  double dVar9;
  Result result;
  double ub;
  double lb;
  bool upperTightened;
  bool lowerTightened;
  bool isIntegral;
  double boundTol;
  double newColLower;
  double newColUpper;
  double val;
  HighsInt col;
  HighsInt nzPos;
  bool logging_on;
  HPresolve *in_stack_fffffffffffffed8;
  HighsInt HVar10;
  HighsPostsolveStack *in_stack_fffffffffffffee0;
  HPresolve *in_stack_fffffffffffffee8;
  HPresolve *in_stack_fffffffffffffef0;
  HPresolve *in_stack_fffffffffffffef8;
  HPresolve *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff28;
  HPresolve *pHVar11;
  HPresolveAnalysis *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  HighsInt HVar12;
  HPresolveAnalysis *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  HighsInt HVar13;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  HighsInt in_stack_ffffffffffffff6c;
  HPresolve *in_stack_ffffffffffffff70;
  HighsInt in_stack_ffffffffffffff7c;
  HighsPostsolveStack *in_stack_ffffffffffffff80;
  double local_78;
  HPresolve *local_70;
  HPresolve *local_68;
  byte local_5b;
  byte local_5a;
  byte local_59;
  double local_58;
  double local_50;
  double local_48;
  HPresolve *local_40;
  HPresolve *local_38;
  value_type local_30;
  value_type local_28;
  uint local_24;
  byte local_1d;
  int local_1c;
  Result local_4;
  
  HVar12 = (HighsInt)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  HVar13 = (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_1d = (in_RDI->analysis_).logging_on_ & 1;
  local_1c = in_EDX;
  if (local_1d != 0) {
    HPresolveAnalysis::startPresolveRuleLog
              (in_stack_ffffffffffffff30,(HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  }
  puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->rowroot,(long)local_1c);
  local_24 = *puVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)(int)local_24);
  local_28 = *pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->Avalue,(long)(int)local_24);
  local_30 = *pvVar4;
  markRowDeleted((HPresolve *)
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                 (HighsInt)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  unlink(in_RDI,(char *)(ulong)local_24);
  HVar10 = (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (local_30 <= 0.0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_lower_,(long)local_28);
    dVar8 = *pvVar4 * local_30;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)local_1c);
    if (dVar8 <= *pvVar4 + in_RDI->primal_feastol) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->col_upper_,(long)local_28);
      dVar9 = *pvVar4 * local_30;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_1c);
      HVar12 = (HighsInt)((ulong)dVar8 >> 0x20);
      if (*pvVar4 - in_RDI->primal_feastol <= dVar9) {
        HighsPostsolveStack::redundantRow(in_stack_fffffffffffffee0,HVar10);
        (in_RDI->analysis_).logging_on_ = (bool)(local_1d & 1);
        if ((local_1d & 1) != 0) {
          HPresolveAnalysis::stopPresolveRuleLog(in_stack_ffffffffffffff40,HVar12);
        }
        RVar1 = checkLimits((HPresolve *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (HighsPostsolveStack *)in_RDI);
        return RVar1;
      }
    }
    HVar12 = (HighsInt)((ulong)dVar8 >> 0x20);
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_upper_,(long)local_28);
    dVar8 = *pvVar4 * local_30;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)local_1c);
    if (dVar8 <= *pvVar4 + in_RDI->primal_feastol) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->col_lower_,(long)local_28);
      in_stack_ffffffffffffff40 = (HPresolveAnalysis *)(*pvVar4 * local_30);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_1c);
      if (*pvVar4 - in_RDI->primal_feastol <= (double)in_stack_ffffffffffffff40) {
        HighsPostsolveStack::redundantRow(in_stack_fffffffffffffee0,HVar10);
        (in_RDI->analysis_).logging_on_ = (bool)(local_1d & 1);
        if ((local_1d & 1) != 0) {
          HPresolveAnalysis::stopPresolveRuleLog(in_stack_ffffffffffffff40,HVar12);
        }
        RVar1 = checkLimits((HPresolve *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (HighsPostsolveStack *)in_RDI);
        return RVar1;
      }
    }
    HVar13 = (HighsInt)((ulong)dVar8 >> 0x20);
  }
  local_38 = (HPresolve *)0x7ff0000000000000;
  local_40 = (HPresolve *)0xfff0000000000000;
  if (local_30 <= 0.0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)local_1c);
    if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)local_1c);
      local_40 = (HPresolve *)(*pvVar4 / local_30);
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)local_1c);
    if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_1c);
      local_38 = (HPresolve *)(*pvVar4 / local_30);
    }
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)local_1c);
    if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)local_1c);
      local_38 = (HPresolve *)(*pvVar4 / local_30);
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)local_1c);
    if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)local_1c);
      local_40 = (HPresolve *)(*pvVar4 / local_30);
    }
  }
  dVar8 = in_RDI->primal_feastol;
  local_50 = 1.0;
  local_58 = ABS(local_30);
  pdVar5 = std::max<double>(&local_50,&local_58);
  local_48 = dVar8 / *pdVar5;
  pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                     (&in_RDI->model->integrality_,(long)local_28);
  pHVar11 = local_40;
  local_59 = *pvVar6 != kContinuous;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_lower_,(long)local_28);
  local_5a = *pvVar4 + local_48 < (double)pHVar11;
  pHVar11 = local_38;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_upper_,(long)local_28);
  local_5b = (double)pHVar11 < *pvVar4 - local_48;
  if ((local_5a & 1) == 0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_lower_,(long)local_28);
    local_68 = (HPresolve *)*pvVar4;
  }
  else {
    if ((local_59 & 1) != 0) {
      local_40 = (HPresolve *)ceil((double)local_40 - local_48);
    }
    local_68 = local_40;
  }
  if ((local_5b & 1) == 0) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_upper_,(long)local_28);
    local_70 = (HPresolve *)*pvVar4;
  }
  else {
    if ((local_59 & 1) != 0) {
      local_38 = (HPresolve *)floor((double)local_38 + local_48);
    }
    local_70 = local_38;
  }
  HVar10 = (HighsInt)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if ((double)local_70 <= (double)local_68 + in_RDI->primal_feastol) {
    if ((double)local_70 < (double)local_68 - in_RDI->primal_feastol) {
      return kPrimalInfeasible;
    }
    in_stack_ffffffffffffff17 = true;
    if ((double)local_68 <= (double)local_70) {
      in_stack_ffffffffffffff16 = false;
      if ((double)local_68 < (double)local_70) {
        in_stack_ffffffffffffff08 = (double)local_70 - (double)local_68;
        local_78 = ABS(local_30);
        in_stack_ffffffffffffff80 = (HighsPostsolveStack *)getMaxAbsColVal(in_RDI,HVar13);
        pdVar5 = std::max<double>(&local_78,(double *)&stack0xffffffffffffff80);
        in_stack_ffffffffffffff16 = in_stack_ffffffffffffff08 * *pdVar5 <= in_RDI->primal_feastol;
      }
      HVar10 = (HighsInt)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      in_stack_ffffffffffffff17 = in_stack_ffffffffffffff16;
    }
    if ((bool)in_stack_ffffffffffffff17 != false) {
      if (((local_5a & 1) == 0) || ((local_5b & 1) == 0)) {
        if ((local_5a & 1) == 0) {
          local_70 = local_68;
          in_stack_fffffffffffffee8 = local_68;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->model->col_upper_,(long)local_28);
          local_5b = (double)in_stack_fffffffffffffee8 < *pvVar4;
        }
        else {
          local_68 = local_70;
          in_stack_fffffffffffffef0 = local_70;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->model->col_lower_,(long)local_28);
          local_5a = *pvVar4 <= (double)in_stack_fffffffffffffef0 &&
                     (double)in_stack_fffffffffffffef0 != *pvVar4;
        }
      }
      else {
        in_stack_fffffffffffffef8 = (HPresolve *)(((double)local_70 + (double)local_68) * 0.5);
        local_70 = in_stack_fffffffffffffef8;
        local_68 = in_stack_fffffffffffffef8;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->col_lower_,(long)local_28);
        local_5a = *pvVar4 <= (double)in_stack_fffffffffffffef8 &&
                   (double)in_stack_fffffffffffffef8 != *pvVar4;
        in_stack_ffffffffffffff00 = local_70;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->model->col_upper_,(long)local_28);
        local_5b = (double)in_stack_ffffffffffffff00 < *pvVar4;
      }
    }
  }
  HighsPostsolveStack::singletonRow
            ((HighsPostsolveStack *)in_stack_ffffffffffffff00,
             (HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0,
             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x30,0));
  HVar13 = (HighsInt)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  if ((local_5a & 1) != 0) {
    changeColLower(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                   (double)in_stack_ffffffffffffff60);
  }
  pHVar11 = local_68;
  if (((double)local_70 != (double)local_68) || (NAN((double)local_70) || NAN((double)local_68))) {
    if ((local_5b & 1) != 0) {
      changeColUpper(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     (double)in_stack_ffffffffffffff60);
    }
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)local_28);
    in_stack_fffffffffffffee0 = (HighsPostsolveStack *)*pvVar4;
    getColumnVector(in_stack_ffffffffffffff00,HVar13);
    HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(double)in_stack_ffffffffffffff70
               ,(double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60);
    removeFixedCol((HPresolve *)
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),HVar10);
    in_stack_fffffffffffffed8 = pHVar11;
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&in_RDI->colDeleted,(long)local_28);
  if ((*pvVar7 == '\0') &&
     (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colsize,(long)local_28),
     *pvVar3 == 0)) {
    local_4 = emptyCol(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    (in_RDI->analysis_).logging_on_ = (bool)(local_1d & 1);
    if ((local_1d & 1) != 0) {
      HPresolveAnalysis::stopPresolveRuleLog(in_stack_ffffffffffffff40,HVar12);
    }
  }
  else {
    (in_RDI->analysis_).logging_on_ = (bool)(local_1d & 1);
    if ((local_1d & 1) != 0) {
      HPresolveAnalysis::stopPresolveRuleLog(in_stack_ffffffffffffff40,HVar12);
    }
    local_4 = checkLimits((HPresolve *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                          ,(HighsPostsolveStack *)in_RDI);
  }
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::singletonRow(HighsPostsolveStack& postsolve_stack,
                                          HighsInt row) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleSingletonRow);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 1);

  // the tree of nonzeros of this row should just contain the single nonzero
  HighsInt nzPos = rowroot[row];
  assert(nzPos != -1);
  // nonzero should have the row in the row array
  assert(Arow[nzPos] == row);
  // tree with one element should not have children
  assert(ARleft[nzPos] == -1);
  assert(ARright[nzPos] == -1);

  HighsInt col = Acol[nzPos];
  double val = Avalue[nzPos];

  // printf("singleton row\n");
  // debugPrintRow(row);
  // delete row singleton nonzero directly, we have all information that we need
  // in local variables
  markRowDeleted(row);
  unlink(nzPos);

  // check for simple
  if (val > 0) {
    if (model->col_upper_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_lower_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  } else {
    if (model->col_lower_[col] * val <=
            model->row_upper_[row] + primal_feastol &&
        model->col_upper_[col] * val >=
            model->row_lower_[row] - primal_feastol) {
      postsolve_stack.redundantRow(row);
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
      return checkLimits(postsolve_stack);
    }
  }

  // zeros should not be linked in the matrix
  assert(std::fabs(val) > options->small_matrix_value);

  double newColUpper = kHighsInf;
  double newColLower = -kHighsInf;
  if (val > 0) {
    if (model->row_upper_[row] != kHighsInf)
      newColUpper = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColLower = model->row_lower_[row] / val;
  } else {
    if (model->row_upper_[row] != kHighsInf)
      newColLower = model->row_upper_[row] / val;
    if (model->row_lower_[row] != -kHighsInf)
      newColUpper = model->row_lower_[row] / val;
  }

  // use either the primal feasibility tolerance for the bound constraint or
  // for the singleton row including scaling, whichever is tighter.
  const double boundTol = primal_feastol / std::max(1.0, std::fabs(val));
  const bool isIntegral = model->integrality_[col] != HighsVarType::kContinuous;

  bool lowerTightened = newColLower > model->col_lower_[col] + boundTol;
  bool upperTightened = newColUpper < model->col_upper_[col] - boundTol;

  double lb, ub;
  if (lowerTightened) {
    if (isIntegral) newColLower = std::ceil(newColLower - boundTol);
    lb = newColLower;
  } else
    lb = model->col_lower_[col];

  if (upperTightened) {
    if (isIntegral) newColUpper = std::floor(newColUpper + boundTol);
    ub = newColUpper;
  } else
    ub = model->col_upper_[col];

  // printf("old bounds [%.15g,%.15g], new bounds [%.15g,%.15g] ... ",
  //        model->col_lower_[col], model->col_upper_[col], lb, ub);
  // check whether the bounds are equal in tolerances
  if (ub <= lb + primal_feastol) {
    // bounds could be infeasible or equal in tolerances, first check infeasible
    if (ub < lb - primal_feastol) return Result::kPrimalInfeasible;

    // bounds are equal in tolerances, if they have a slight infeasibility below
    // those tolerances or they have a slight numerical distance which changes
    // the largest contribution below feasibility tolerance then we can safely
    // set the bound to one of the values. To heuristically get rid of numerical
    // errors we choose the bound that was not tightened, or the midpoint if
    // both where tightened.
    if (ub < lb || (ub > lb && (ub - lb) * std::max(std::fabs(val),
                                                    getMaxAbsColVal(col)) <=
                                   primal_feastol)) {
      if (lowerTightened && upperTightened) {
        ub = 0.5 * (ub + lb);
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
        upperTightened = ub < model->col_upper_[col];
      } else if (lowerTightened) {
        lb = ub;
        lowerTightened = lb > model->col_lower_[col];
      } else {
        ub = lb;
        upperTightened = ub < model->col_upper_[col];
      }
    }
  }

  // printf("final bounds: [%.15g,%.15g]\n", lb, ub);

  postsolve_stack.singletonRow(row, col, val, lowerTightened, upperTightened);

  // just update bounds (and row activities)
  if (lowerTightened) changeColLower(col, lb);
  // update bounds, or remove as fixed column directly
  if (ub == lb) {
    postsolve_stack.removedFixedCol(col, lb, model->col_cost_[col],
                                    getColumnVector(col));
    removeFixedCol(col);
  } else if (upperTightened)
    changeColUpper(col, ub);

  if (!colDeleted[col] && colsize[col] == 0) {
    Result result = emptyCol(postsolve_stack, col);
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
    return result;
  }
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleSingletonRow);
  return checkLimits(postsolve_stack);
}